

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int __fd;
  int iVar2;
  int __fd_00;
  ostream *poVar3;
  size_t __nbytes;
  char *__s;
  int addrlen;
  int opt;
  string message;
  sockaddr_in address;
  AddressBook address_book;
  
  opt = 1;
  addrlen = 0x10;
  __fd = socket(2,1,0);
  if (__fd == 0) {
    __s = "socket failed";
  }
  else {
    iVar2 = setsockopt(__fd,1,0xf,&opt,4);
    if (iVar2 == 0) {
      address.sin_family = 2;
      address.sin_port = 0xf27;
      address.sin_addr.s_addr = 0;
      iVar2 = bind(__fd,(sockaddr *)&address,0x10);
      if (iVar2 < 0) {
        __s = "bind failed";
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"server start listening on ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,9999);
        std::operator<<(poVar3,"...\n");
        iVar2 = listen(__fd,3);
        if (iVar2 < 0) {
          __s = "listen";
        }
        else {
          iVar2 = 0;
          while( true ) {
            __fd_00 = accept(__fd,(sockaddr *)&address,(socklen_t *)&addrlen);
            if (__fd_00 == 0) {
              return 0;
            }
            if (__fd_00 < 0) break;
            message._M_dataplus._M_p = (pointer)&message.field_2;
            message._M_string_length = 0;
            message.field_2._M_local_buf[0] = '\0';
            read(__fd_00,&message,__nbytes);
            Messages::AddressBook::AddressBook(&address_book);
            cVar1 = google::protobuf::MessageLite::ParseFromString((string *)&address_book);
            if (cVar1 == '\0') {
              poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to parse address book.");
              std::endl<char,std::char_traits<char>>(poVar3);
              iVar2 = -1;
            }
            else {
              list_people(&address_book);
            }
            Messages::AddressBook::~AddressBook(&address_book);
            std::__cxx11::string::~string((string *)&message);
            if (cVar1 == '\0') {
              return iVar2;
            }
          }
          __s = "accept";
        }
      }
    }
    else {
      __s = "setsockopt";
    }
  }
  perror(__s);
  exit(1);
}

Assistant:

int main(int argc, char const *argv[]) 
{ 
	int server_fd, new_socket; 
	struct sockaddr_in address; 
	int opt = 1; 
	int addrlen = sizeof(address); 
	
	// Creating socket file descriptor 
	if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) 
	{ 
		perror("socket failed"); 
		exit(EXIT_FAILURE); 
	} 
	
	// Forcefully attaching socket to the port 8080 
	if (setsockopt(server_fd, SOL_SOCKET, SO_REUSEADDR | SO_REUSEPORT, 
												&opt, sizeof(opt))) 
	{ 
		perror("setsockopt"); 
		exit(EXIT_FAILURE); 
	} 
	address.sin_family = AF_INET; 
	address.sin_addr.s_addr = INADDR_ANY; 
	address.sin_port = htons( PORT ); 
	
	// Forcefully attaching socket to the port 8080 
	if (bind(server_fd, (struct sockaddr *)&address, 
								sizeof(address))<0) 
	{ 
		perror("bind failed"); 
		exit(EXIT_FAILURE); 
	} 
	cout << "server start listening on "<< PORT <<"...\n";
	if (listen(server_fd, 3) < 0) 
	{ 
		perror("listen"); 
		exit(EXIT_FAILURE); 
	} 
	while ((new_socket = accept(server_fd, (struct sockaddr *)&address, 
					(socklen_t*)&addrlen))) 
	{ 
		if(new_socket < 0) {
			perror("accept"); 
			exit(EXIT_FAILURE); 
		} else
		{
			string message;
			read(new_socket, message);
			Messages::AddressBook address_book;
			if (!address_book.ParseFromString(message)) {
				cerr << "Failed to parse address book." << endl;
				return -1;
			}
			list_people(address_book);
		}
	} 

	return 0; 
}